

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMockerBase<void_(int,_mp::var::Type)>::UntypedPerformAction
          (FunctionMockerBase<void_(int,_mp::var::Type)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<void> *pAVar1;
  ArgumentTuple *args;
  Action<void_(int,_mp::var::Type)> action;
  Action<void_(int,_mp::var::Type)> *in_stack_ffffffffffffffa8;
  Action<void_(int,_mp::var::Type)> *this_00;
  Action<void_(int,_mp::var::Type)> local_28 [2];
  
  this_00 = local_28;
  Action<void_(int,_mp::var::Type)>::Action(this_00,in_stack_ffffffffffffffa8);
  pAVar1 = ActionResultHolder<void>::PerformAction<void(int,mp::var::Type)>
                     (this_00,(ArgumentTuple *)in_stack_ffffffffffffffa8);
  Action<void_(int,_mp::var::Type)>::~Action((Action<void_(int,_mp::var::Type)> *)0x27c3a1);
  return (UntypedActionResultHolderBase *)pAVar1;
}

Assistant:

virtual UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, const void* untyped_args) const {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    const ArgumentTuple& args =
        *static_cast<const ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, args);
  }